

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O0

String * Rml::ComputeFontFamily(String *__return_storage_ptr__,String *font_family)

{
  String local_38;
  String *local_18;
  String *font_family_local;
  
  local_18 = font_family;
  font_family_local = __return_storage_ptr__;
  ::std::__cxx11::string::string((string *)&local_38,(string *)font_family);
  StringUtilities::ToLower(__return_storage_ptr__,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

String ComputeFontFamily(String font_family)
{
	return StringUtilities::ToLower(std::move(font_family));
}